

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpsgame.h
# Opt level: O0

ban * __thiscall server::ban::operator=(ban *this,ban *b)

{
  ban *b_local;
  ban *this_local;
  
  if (b != this) {
    this->time = b->time;
    this->expire = b->expire;
    this->ip = b->ip;
    this->type = b->type;
    if (this->reason != (char *)0x0) {
      operator_delete__(this->reason);
    }
    this->reason = b->reason;
    b->reason = (char *)0x0;
  }
  return this;
}

Assistant:

ban &operator =(const ban &b)
        {
            if(&b != this) {
                time = b.time;
                expire = b.expire;
                ip = b.ip;
                type = b.type;
                delete[] reason;
                reason = b.reason;
                ((ban *)&b)->reason = NULL;    // ugly hack
            }
            return *this;
        }